

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vocab.c
# Opt level: O2

int vocgobj(voccxdef *ctx,char **cmd,int *typelist,int cur,int *next,int complain,vocoldef *nounlist
           ,int multi,int chkact,int *no_match)

{
  runsdef *prVar1;
  objnum *poVar2;
  undefined8 *puVar3;
  undefined8 *puVar4;
  byte bVar5;
  char cVar6;
  objnum oVar7;
  runsdef *prVar8;
  ushort *puVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  bool bVar13;
  uint16_t tmp;
  undefined2 uVar14;
  uint uVar15;
  uint uVar16;
  undefined4 uVar17;
  int iVar18;
  int iVar19;
  objnum *list;
  size_t sVar20;
  uchar *puVar21;
  vocoldef *nounlist_00;
  ushort **ppuVar22;
  uint uVar23;
  ulong uVar24;
  ulong uVar25;
  undefined4 *puVar26;
  int extraout_EDX;
  int extraout_EDX_00;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar27;
  undefined8 extraout_RDX_01;
  long lVar28;
  char *pcVar29;
  long lVar30;
  undefined2 *puVar31;
  runcxdef *prVar32;
  uint *puVar33;
  uint lstsiz;
  long lVar34;
  long lVar35;
  uint *puVar36;
  uint *puVar37;
  bool bVar38;
  bool bVar39;
  ulong local_160;
  long local_148;
  uint local_134;
  runcxdef *local_130;
  uint local_124;
  undefined2 *local_120;
  int local_118;
  int local_114;
  uint *local_110;
  int local_104;
  int local_100;
  uint local_fc;
  ulong local_f8;
  uchar *local_f0;
  objnum *local_e8;
  uint local_e0;
  int local_dc;
  ulong local_d8;
  ulong local_d0;
  ulong local_c8;
  uint *local_c0;
  uint local_b4;
  char *local_b0;
  long local_a8;
  long local_a0;
  uint *local_98;
  ushort *local_90;
  int local_84;
  undefined2 *local_80;
  ulong local_78;
  long local_70;
  undefined2 *local_68;
  char **local_60;
  ulong local_58;
  char *local_50;
  uchar *local_48;
  runsdef val;
  
  local_48 = ctx->voc_stk_cur;
  local_114 = complain;
  local_120 = (undefined2 *)voc_stk_alo(ctx,8000);
  bVar38 = chkact != 0;
  local_50 = ". Checking for actor\\n";
  if (!bVar38) {
    local_50 = ". Reading noun phrase\\n";
  }
  local_84 = (uint)bVar38 * 3 + 5;
  local_58 = (ulong)(bVar38 || multi == 0);
  local_68 = local_120 + 0x24;
  local_80 = local_120 + 0x10;
  local_60 = cmd + 1;
  local_78 = CONCAT71((int7)((ulong)local_60 >> 8),1);
  local_b4 = (uint)local_78;
  local_a0 = 0;
  local_110 = (uint *)next;
LAB_001f679e:
  puVar33 = local_110;
  local_f0 = ctx->voc_stk_cur;
  local_e8 = (objnum *)voc_stk_alo(ctx,400);
  local_98 = (uint *)voc_stk_alo(ctx,800);
  list = (objnum *)voc_stk_alo(ctx,400);
  local_c0 = (uint *)voc_stk_alo(ctx,800);
  local_b0 = (char *)voc_stk_alo(ctx,0x80);
  if (no_match != (int *)0x0) {
    *no_match = 0;
  }
  *puVar33 = cur;
  if ((cur == 0xffffffff) || (local_160 = (ulong)cur, cmd[local_160] == (char *)0x0))
  goto LAB_001f7a5c;
  if ((ctx->voccxflg & 4) != 0) {
    outformat(local_50);
  }
  if (ctx->voccxpnp != 0xffff) {
    prVar32 = ctx->voccxrun;
    val.runstyp = (uchar)local_84;
    runpush(prVar32,local_84,&val);
    iVar18 = (uint)(local_114 != 0) * 3 + 5;
    val.runstyp = (uchar)iVar18;
    runpush(prVar32,iVar18,&val);
    runpnum(prVar32,(long)(int)(cur + 1));
    for (lVar30 = 0; (cmd[lVar30] != (char *)0x0 && (*cmd[lVar30] != '\0')); lVar30 = lVar30 + 1) {
    }
    uVar23 = (uint)lVar30;
    local_130 = prVar32;
    voc_push_numlist(ctx,(uint *)typelist,uVar23);
    lstsiz = 0;
    for (lVar30 = 0; uVar23 != (uint)lVar30; lVar30 = lVar30 + 1) {
      sVar20 = strlen(cmd[lVar30]);
      lstsiz = lstsiz + (int)sVar20 + 3;
    }
    puVar21 = voc_push_list_siz(ctx,lstsiz);
    for (lVar30 = 0; prVar32 = local_130, uVar23 != (uint)lVar30; lVar30 = lVar30 + 1) {
      *puVar21 = '\x03';
      sVar20 = strlen(cmd[lVar30]);
      *(short *)(puVar21 + 1) = (short)sVar20 + 2;
      memcpy(puVar21 + 3,cmd[lVar30],sVar20);
      puVar21 = puVar21 + sVar20 + 3;
    }
    runfn(local_130,ctx->voccxpnp,5);
    puVar33 = local_110;
    prVar8 = prVar32->runcxsp;
    prVar1 = prVar8 + -1;
    if (prVar8[-1].runstyp == '\a') {
      prVar32->runcxsp = prVar1;
      if (prVar1->runstyp != '\a') {
        prVar32->runcxerr->errcxptr->erraac = 0;
        runsign(prVar32,0x3fc);
      }
      puVar9 = (ushort *)prVar8[-1].runsv.runsvstr;
      local_134 = *puVar9 - 2;
      local_90 = puVar9 + 1;
      local_130 = (runcxdef *)0x0;
      prVar32 = local_130;
      if (local_134 < 2) {
        iVar18 = 2;
      }
      else {
        iVar18 = 2;
        if ((char)*local_90 == '\x01') {
          uVar15 = *(int *)((long)puVar9 + 3) - 1;
          *local_110 = uVar15;
          uVar16 = cur;
          if (((int)uVar15 < cur) || (uVar16 = uVar23, (int)uVar23 < (int)uVar15)) {
            *local_110 = uVar16;
          }
          lstadv((uchar **)&local_90,&local_134);
          puVar31 = local_120;
          for (local_130 = (runcxdef *)0x0; (uint)local_130 < 199;
              local_130 = (runcxdef *)(ulong)((int)local_130 + 1)) {
            while( true ) {
              if (local_134 == 0) goto LAB_001f6af2;
              if ((char)*local_90 == '\x05') {
                uVar14 = 0xffff;
                goto LAB_001f6a76;
              }
              if ((char)*local_90 == '\x02') break;
              lstadv((uchar **)&local_90,&local_134);
            }
            uVar14 = *(undefined2 *)((long)local_90 + 1);
LAB_001f6a76:
            *puVar31 = uVar14;
            lstadv((uchar **)&local_90,&local_134);
            if ((local_134 == 0) || ((char)*local_90 != '\x01')) {
              *(undefined4 *)(puVar31 + 0x10) = 0;
            }
            else {
              *(undefined4 *)(puVar31 + 0x10) = *(undefined4 *)((long)local_90 + 1);
              lstadv((uchar **)&local_90,&local_134);
            }
            *(char **)(puVar31 + 4) = cmd[local_160];
            *(char **)(puVar31 + 8) = cmd[(long)(int)*puVar33 + -1];
            puVar31 = puVar31 + 0x14;
          }
LAB_001f6af2:
          *puVar31 = 0xffff;
          *(undefined4 *)(puVar31 + 0x10) = 0;
          lVar30 = local_160;
          if (no_match != (int *)0x0) {
            uVar23 = 0;
            if ((int)local_130 == 0) {
              uVar23 = (uint)(cur < (int)*puVar33);
            }
            *no_match = uVar23;
          }
          for (; lVar30 < (int)*puVar33; lVar30 = lVar30 + 1) {
            if ((*(byte *)(typelist + lVar30) & 0x80) != 0) {
              ctx->voccxunknown = ctx->voccxunknown + -1;
            }
          }
          uVar24 = (ulong)local_130 & 0xffffffff;
          while (iVar18 = (int)uVar24, uVar24 = (ulong)(iVar18 - 1), iVar18 != 0) {
            if ((*(byte *)((long)local_120 + 0x21) & 8) != 0) {
              ctx->voccxunknown = ctx->voccxunknown + 1;
            }
          }
          iVar18 = 3;
          prVar32 = local_130;
        }
      }
    }
    else {
      if (prVar8[-1].runstyp != '\x01') {
        prVar32->runcxsp = prVar1;
        goto LAB_001f6ae7;
      }
      prVar32->runcxsp = prVar1;
      if (prVar1->runstyp != '\x01') {
        prVar32->runcxerr->errcxptr->erraac = 0;
        runsign(prVar32,0x3eb);
      }
      iVar18 = *(int *)&prVar8[-1].runsv;
      prVar32 = (runcxdef *)0x0;
    }
    if (iVar18 == 2) goto LAB_001f6b94;
    if (iVar18 == 3) {
      ctx->voc_stk_cur = local_f0;
      goto LAB_001f6f95;
    }
LAB_001f7944:
    uVar16 = 0xffffffff;
    goto LAB_001f7a98;
  }
LAB_001f6ae7:
  prVar32 = (runcxdef *)0x0;
LAB_001f6b94:
  bVar5 = *cmd[local_160];
  local_a8 = (long)(int)prVar32;
  local_130 = prVar32;
  if ((1 < bVar5 - 0x41) && (bVar5 != 0x59)) {
    if (bVar5 != 0x22) {
LAB_001f6ca8:
      uVar16 = 0;
      goto LAB_001f6d7d;
    }
    if (chkact != 0) goto LAB_001f7a5c;
    if ((ctx->voccxflg & 4) != 0) {
      outformat("... found quoted string\\n");
    }
    local_120[local_a8 * 0x14] = 0xffff;
    *(undefined4 *)(local_120 + local_a8 * 0x14 + 0x10) = 0x400;
    pcVar29 = cmd[local_160];
    *(char **)(local_120 + local_a8 * 0x14 + 8) = pcVar29;
    *(char **)(local_120 + local_a8 * 0x14 + 4) = pcVar29;
    *local_110 = cur + 1;
    prVar32 = (runcxdef *)(ulong)((int)local_a8 + 1);
    goto LAB_001f6f86;
  }
  lVar30 = (long)cur;
  if (cmd[lVar30 + 1] == (char *)0x0) goto LAB_001f6ca8;
  if (chkact != 0) goto LAB_001f7a5c;
  local_124 = (uint)(bVar5 == 0x59);
  iVar18 = voc_check_special(ctx,cmd[lVar30 + 1],(int)prVar32);
  local_f8 = CONCAT44(local_f8._4_4_,iVar18);
  uVar27 = extraout_RDX;
  if (iVar18 == 0) {
    uVar23 = cur + 1;
    lVar30 = lVar30 + 1;
  }
  else {
    if ((ctx->voccxflg & 4) != 0) {
      outformat("... found ALL/ANY/BOTH/EITHER OF\\n");
      uVar27 = extraout_RDX_00;
    }
    if (cmd[lVar30 + 2] == (char *)0x0) {
      if (*cmd[local_160] == 'A') {
        iVar18 = 4;
        pcVar29 = "I think you left something out after \"all of\".";
      }
      else if (*cmd[local_160] == 'Y') {
        iVar18 = 0x1d;
        pcVar29 = "I think you left something out after \"any of\".";
      }
      else {
        pcVar29 = "There\'s something missing after \"both of\".";
        iVar18 = 5;
      }
LAB_001f793d:
      vocerr(ctx,iVar18,pcVar29);
      goto LAB_001f7944;
    }
    uVar23 = cur + 2;
    lVar30 = lVar30 + 2;
  }
  iVar18 = (typelist[lVar30] & 1U) + uVar23;
  while( true ) {
    if (cmd[iVar18] == (char *)0x0) break;
    iVar19 = voc_check_special(ctx,cmd[iVar18],(int)uVar27);
    uVar27 = extraout_RDX_01;
    if (iVar19 == 0) {
      if ((*(byte *)(typelist + iVar18) & 6) == 0) break;
LAB_001f6d0b:
      iVar18 = iVar18 + 1;
    }
    else {
      if ((byte *)cmd[(long)iVar18 + 1] == (byte *)0x0) {
        pcVar29 = "I expected a noun after \"of\".";
        iVar18 = 6;
        goto LAB_001f793d;
      }
      if ((*cmd[(long)iVar18 + 1] & 1U) == 0) goto LAB_001f6d0b;
      iVar18 = iVar18 + 2;
    }
  }
  prVar32 = local_130;
  uVar16 = local_124;
  if ((cur < iVar18) &&
     (((bVar5 == 0x59 && (int)local_f8 == 0 || ((typelist[(long)iVar18 + -1] & 0x40U) != 0)) &&
      (local_160 = lVar30, cur = uVar23, (ctx->voccxflg & 4) != 0)))) {
    outformat("... found ALL/ANY/BOTH/EITHER + noun phrase\\n");
    uVar16 = local_124;
  }
LAB_001f6d7d:
  lVar30 = local_a8;
  puVar33 = local_110;
  bVar5 = *cmd[local_160];
  local_148 = (long)cur;
  local_f8 = (ulong)prVar32 & 0xffffffff;
  if (((char)uVar16 == '\0') && (bVar5 == 0x41)) {
    if (chkact != 0) goto LAB_001f7a5c;
    if ((ctx->voccxflg & 4) != 0) {
      outformat("... found ALL\\n");
    }
    puVar33 = local_110;
    local_120[local_a8 * 0x14] = 0xffff;
    *(undefined4 *)(local_120 + local_a8 * 0x14 + 0x10) = 1;
    pcVar29 = cmd[local_160];
    *(char **)(local_120 + local_a8 * 0x14 + 8) = pcVar29;
    *(char **)(local_120 + local_a8 * 0x14 + 4) = pcVar29;
    prVar32 = (runcxdef *)(ulong)((int)local_a8 + 1);
    uVar23 = cur + 1;
    if ((cmd[local_148 + 1] != (char *)0x0) && (*cmd[local_148 + 1] == 'X')) {
      if ((ctx->voccxflg & 4) != 0) {
        outformat("... found ALL EXCEPT\\n");
      }
      nounlist_00 = (vocoldef *)voc_stk_alo(ctx,8000);
      uVar16 = vocgobj(ctx,cmd,typelist,cur + 2,(int *)puVar33,local_114,nounlist_00,1,0,(int *)0x0)
      ;
      if ((int)uVar16 < 0) goto LAB_001f7a98;
      uVar23 = *puVar33;
      prVar32 = (runcxdef *)(ulong)(uVar16 + (int)local_130 + 1);
      for (lVar30 = 0; (ulong)uVar16 * 0x28 - lVar30 != 0; lVar30 = lVar30 + 0x28) {
        uVar27 = *(undefined8 *)((long)&nounlist_00->vocolflg + lVar30);
        *(undefined8 *)((long)local_68 + lVar30 + local_f8 * 0x28) = uVar27;
        puVar4 = (undefined8 *)((long)&nounlist_00->vocolobj + lVar30);
        uVar10 = *puVar4;
        uVar11 = puVar4[1];
        puVar4 = (undefined8 *)((long)&nounlist_00->vocollst + lVar30);
        uVar12 = puVar4[1];
        puVar3 = (undefined8 *)((long)local_68 + lVar30 + local_f8 * 0x28 + -0x10);
        *puVar3 = *puVar4;
        puVar3[1] = uVar12;
        puVar4 = (undefined8 *)((long)local_68 + lVar30 + local_f8 * 0x28 + -0x20);
        *puVar4 = uVar10;
        puVar4[1] = uVar11;
        *(byte *)((long)local_68 + lVar30 + local_f8 * 0x28) = (byte)uVar27 | 2;
      }
    }
    *puVar33 = uVar23;
    local_120[(long)(int)prVar32 * 0x14] = 0xffff;
    *(undefined4 *)(local_120 + (long)(int)prVar32 * 0x14 + 0x10) = 0;
  }
  else {
    uVar17 = 4;
    local_124 = uVar16;
    if ((ulong)bVar5 != 0x49) {
      if (bVar5 == 0x4d) {
        uVar17 = 0x100;
      }
      else if (bVar5 == 0x52) {
        uVar17 = 0x200;
      }
      else {
        if (bVar5 != 0x54) {
          uVar23 = typelist[local_160];
          if (((uVar23 & 0x87) != 0) ||
             ((-1 < (char)bVar5 &&
              (ppuVar22 = __ctype_b_loc(),
              (*(byte *)((long)*ppuVar22 + (ulong)bVar5 * 2 + 1) & 8) != 0)))) {
            if ((uVar23 & 1) == 0) {
              pcVar29 = cmd[local_148];
            }
            else {
              cur = cur + 1;
              pcVar29 = cmd[local_148 + 1];
              if ((pcVar29 == (char *)0x0) ||
                 ((local_148 = local_148 + 1, (*(byte *)(typelist + local_148) & 0x86) == 0 &&
                  ((cVar6 = *pcVar29, (long)cVar6 < 0 ||
                   (ppuVar22 = __ctype_b_loc(),
                   (*(byte *)((long)*ppuVar22 + (long)cVar6 * 2 + 1) & 8) == 0)))))) {
                vocerr(ctx,7,"An article must be followed by a noun.");
                *local_110 = cur;
                goto LAB_001f7944;
              }
            }
            local_dc = 0;
            local_160 = 0xffffffffffffffff;
            uVar24 = (ulong)(uint)cur;
            iVar18 = 0;
            while (local_118 = iVar18, pcVar29 != (char *)0x0) {
              iVar19 = (int)uVar24;
              uVar23 = typelist[iVar19];
              if ((uVar23 & 2) == 0) {
                if ((char)uVar23 < '\0') {
                  local_118 = iVar18 + 1;
                  goto LAB_001f71f9;
                }
                if ((uVar23 & 4) != 0) {
                  uVar23 = iVar19 + 1;
                  pcVar29 = cmd[(long)iVar19 + 1];
                  if (pcVar29 != (char *)0x0) {
                    cVar6 = *pcVar29;
                    if (-1 < (long)cVar6) {
                      ppuVar22 = __ctype_b_loc();
                      uVar16 = iVar19 + 2;
                      if ((*(byte *)((long)*ppuVar22 + (long)cVar6 * 2 + 1) & 8) == 0) {
                        uVar16 = uVar23;
                      }
                      uVar23 = uVar16;
                      pcVar29 = cmd[(int)uVar23];
                      uVar24 = (ulong)uVar23;
                      iVar18 = extraout_EDX_00;
                      if (pcVar29 == (char *)0x0) break;
                    }
                    iVar18 = voc_check_special(ctx,pcVar29,iVar18);
                    if (iVar18 != 0) goto LAB_001f7290;
                  }
                  uVar24 = (ulong)uVar23;
                  break;
                }
                cVar6 = *pcVar29;
                local_d0 = uVar24;
                if (((long)cVar6 < 0) ||
                   (ppuVar22 = __ctype_b_loc(), iVar18 = extraout_EDX,
                   (*(byte *)((long)*ppuVar22 + (long)cVar6 * 2 + 1) & 8) == 0)) {
                  iVar18 = voc_check_special(ctx,pcVar29,iVar18);
                  uVar24 = local_d0;
                  if ((iVar18 == 0) || ((int)local_160 != -1)) break;
                  local_160 = local_d0;
                  uVar24 = (ulong)((2 - (uint)((*(byte *)(typelist + (long)iVar19 + 1) & 1) == 0)) +
                                  (int)local_d0);
                }
                else {
                  uVar23 = (int)local_d0 + 1;
LAB_001f7290:
                  uVar24 = (ulong)uVar23;
                }
              }
              else {
LAB_001f71f9:
                uVar24 = (ulong)(iVar19 + 1);
              }
              pcVar29 = cmd[(int)uVar24];
              iVar18 = local_118;
              if ((pcVar29 != (char *)0x0) && ((*(byte *)(typelist + (int)uVar24) & 0x40) != 0)) {
                local_dc = 1;
              }
            }
            local_e0 = cur + 1;
            local_70 = (long)(int)local_e0;
            local_fc = 0;
            bVar38 = true;
            local_100 = 0;
            uVar25 = uVar24 & 0xffffffff;
            local_104 = -1;
            local_d0 = uVar24;
            while( true ) {
              uVar23 = (uint)uVar25;
              voc_make_obj_name(ctx,local_b0,cmd,cur,uVar23);
              *local_110 = uVar23;
              if (0 < local_118) break;
              local_c8 = uVar25 & 0xffffffff;
              uVar23 = vocgol(ctx,local_e8,local_98,cmd,typelist,cur,cur,uVar23,(int)local_160);
              pcVar29 = cmd[local_148];
              cVar6 = *pcVar29;
              lVar30 = (long)cVar6;
              if (lVar30 < 0) {
                bVar39 = false;
              }
              else {
                ppuVar22 = __ctype_b_loc();
                if ((((((*ppuVar22)[lVar30] >> 0xb & 1) == 0) || (bVar39 = true, local_dc == 0)) &&
                    (bVar39 = false, ((*ppuVar22)[lVar30] >> 0xb & 1) != 0)) &&
                   ((uint)local_c8 != local_e0)) {
                  iVar18 = atoi(pcVar29);
                  bVar39 = iVar18 == 1;
                }
              }
              bVar13 = bVar39;
              if ((int)uVar23 < 1) {
                if (chkact != 0) goto LAB_001f7a5c;
                if ((cVar6 < '\0') ||
                   (ppuVar22 = __ctype_b_loc(),
                   (*(byte *)((long)*ppuVar22 + lVar30 * 2 + 1) & 8) == 0)) {
                  if (uVar23 == 0) {
                    vocerr(ctx,9,"I don\'t see any %s here.",local_b0);
                  }
                  goto LAB_001f7944;
                }
                local_100 = 1;
                bVar13 = false;
                if (!bVar39) {
                  local_120[local_a8 * 0x14] = 0xffff;
                  *(undefined4 *)(local_120 + local_a8 * 0x14 + 0x10) = 0x10;
                  pcVar29 = cmd[local_148];
                  *(char **)(local_120 + local_a8 * 0x14 + 8) = pcVar29;
                  *(char **)(local_120 + local_a8 * 0x14 + 4) = pcVar29;
                  *local_110 = local_e0;
                  uVar23 = (int)local_130 + 1;
                  prVar32 = (runcxdef *)(ulong)uVar23;
                  local_120[(long)(int)uVar23 * 0x14] = 0xffff;
                  *(undefined4 *)(local_120 + (long)(int)uVar23 * 0x14 + 0x10) = 0;
                  goto LAB_001f6f86;
                }
              }
              iVar18 = (int)local_c8;
              lVar35 = (long)(int)local_c8;
              bVar13 = !bVar13;
              local_d8 = local_160;
              lVar30 = local_70;
              uVar24 = local_d8;
LAB_001f741e:
              while( true ) {
                local_d8 = uVar24;
                if (lVar35 <= lVar30) {
                  if ((ctx->voccxflg & 4) != 0) {
                    outformat("... found objects matching vocabulary:\\n");
                  }
                  bVar39 = local_100 != 0;
                  lVar30 = (long)local_104;
                  if ((int)uVar23 < 1) {
                    uVar23 = 0;
                  }
                  puVar36 = (uint *)(ulong)(200 - (int)local_130);
                  puVar33 = (uint *)(local_80 + local_f8 * 0x14);
                  puVar37 = (uint *)0x0;
                  local_c0 = puVar36;
                  goto LAB_001f76e3;
                }
                iVar19 = voc_check_special(ctx,cmd[lVar30],iVar18);
                if ((iVar19 == 0) && ((*(byte *)(typelist + lVar30) & 1) == 0)) break;
LAB_001f74ca:
                lVar30 = lVar30 + 1;
                uVar24 = local_d8;
              }
              uVar16 = vocgol(ctx,list,local_c0,cmd,typelist,cur,(int)lVar30,(int)local_c8,
                              (int)local_d8);
              if ((int)uVar16 < 0) goto LAB_001f7944;
              if (uVar23 == 0) {
                memcpy(local_e8,list,(ulong)(uVar16 * 2 + 2));
                memcpy(local_98,local_c0,(ulong)uVar16 << 2);
                uVar23 = uVar16;
              }
              else {
                lVar28 = 0;
                uVar23 = 0;
                while( true ) {
                  oVar7 = local_e8[lVar28];
                  if (oVar7 == 0xffff) break;
                  lVar34 = 0;
                  do {
                    poVar2 = (objnum *)((long)list + lVar34);
                    if (*poVar2 == 0xffff) goto LAB_001f7532;
                    lVar34 = lVar34 + 2;
                  } while (oVar7 != *poVar2);
                  local_e8[(int)uVar23] = oVar7;
                  local_98[(int)uVar23] =
                       *(uint *)((long)local_c0 + lVar34 * 2 + -4) | local_98[lVar28];
                  uVar23 = uVar23 + 1;
LAB_001f7532:
                  lVar28 = lVar28 + 1;
                }
                local_e8[(int)uVar23] = 0xffff;
              }
              if (uVar23 != 0) goto LAB_001f74ca;
              if ((ctx->voccxflg & 4) != 0) {
                outformat("... can\'t find any objects matching these words\\n");
              }
              iVar19 = (int)local_c8;
              if ((int)local_d8 != -1) {
                bVar5 = ctx->voccxflg;
                pcVar29 = "... dropping the part after OF and retrying\\n";
                uVar25 = local_d8;
                goto LAB_001f7635;
              }
              if (!bVar13) {
                uVar23 = 0;
                bVar13 = true;
                local_100 = 1;
                local_d8 = 0xffffffffffffffff;
                lVar30 = local_70;
                uVar24 = 0xffffffffffffffff;
                if ((ctx->voccxflg & 4) != 0) {
                  outformat("... treating the number as a count and retrying\\n");
                  local_100 = 1;
                  local_d8 = 0xffffffffffffffff;
                  lVar30 = local_70;
                  uVar24 = local_d8;
                }
                goto LAB_001f741e;
              }
              uVar25 = local_c8 & 0xffffffff;
              do {
                lVar35 = lVar35 + -1;
                if (lVar35 <= local_148) {
                  if (chkact == 0) {
                    if (local_114 != 0) {
                      vocerr(ctx,9,"I don\'t see any %s here.",local_b0);
                    }
                    if (no_match != (int *)0x0) {
                      *no_match = 1;
                    }
                  }
                  goto LAB_001f7a5c;
                }
                uVar25 = (ulong)((int)uVar25 - 1);
              } while ((*(byte *)(typelist + lVar35) & 8) == 0);
              bVar5 = ctx->voccxflg;
              pcVar29 = "... changing word to prep and retrying\\n";
LAB_001f7635:
              local_fc = 0x4000;
              bVar38 = false;
              local_160 = 0xffffffffffffffff;
              local_104 = iVar19;
              if ((bVar5 & 4) != 0) {
                local_d8 = uVar25;
                outformat(pcVar29);
                local_fc = 0x4000;
                bVar38 = false;
                local_160 = 0xffffffffffffffff;
                uVar25 = local_d8;
                local_104 = iVar19;
              }
            }
            lVar30 = local_f8 << 0x20;
            puVar26 = (undefined4 *)(local_80 + local_f8 * 0x14);
            prVar32 = local_130;
            for (iVar18 = local_118; 0 < iVar18; iVar18 = iVar18 + -1) {
              *(undefined2 *)(puVar26 + -8) = 0xffff;
              *puVar26 = 0x800;
              *(char **)(puVar26 + -6) = cmd[local_148];
              *(char **)(puVar26 + -4) = cmd[(long)(int)local_d0 + -1];
              lVar30 = lVar30 + 0x100000000;
              prVar32 = (runcxdef *)(ulong)((int)prVar32 + 1);
              puVar26 = puVar26 + 10;
            }
            local_120[(lVar30 >> 0x20) * 0x14] = 0xffff;
            *(undefined4 *)(local_120 + (lVar30 >> 0x20) * 0x14 + 0x10) = 0;
            goto LAB_001f6f86;
          }
          goto LAB_001f7a5c;
        }
        uVar17 = 8;
      }
    }
    *(undefined4 *)(local_120 + local_a8 * 0x14 + 0x10) = uVar17;
    if ((ctx->voccxflg & 4) != 0) {
      outformat("... found pronoun\\n");
    }
    *puVar33 = cur + 1;
    local_120[lVar30 * 0x14] = 0xffff;
    pcVar29 = cmd[local_160];
    *(char **)(local_120 + lVar30 * 0x14 + 8) = pcVar29;
    *(char **)(local_120 + lVar30 * 0x14 + 4) = pcVar29;
    prVar32 = (runcxdef *)(ulong)((int)local_130 + 1);
  }
LAB_001f6f86:
  ctx->voc_stk_cur = local_f0;
  uVar16 = (uint)prVar32;
  if ((int)uVar16 < 0) goto LAB_001f7a98;
LAB_001f6f95:
  if ((int)prVar32 == 0) {
LAB_001f7a5c:
    if ((local_b4 & 1) == 0) {
      *local_110 = (uint)local_78;
    }
LAB_001f7a7d:
    uVar16 = (uint)local_a0;
    nounlist[(int)uVar16].vocolobj = 0xffff;
    nounlist[(int)uVar16].vocolflg = 0;
LAB_001f7a98:
    ctx->voc_stk_cur = local_48;
    return uVar16;
  }
  lVar30 = (long)(int)local_a0;
  uVar24 = (ulong)prVar32 & 0xffffffff;
  if ((int)prVar32 < 1) {
    uVar24 = 0;
  }
  lVar35 = lVar30;
  for (lVar28 = 0; uVar24 * 0x28 - lVar28 != 0; lVar28 = lVar28 + 0x28) {
    *(undefined8 *)((long)&nounlist[lVar30].vocolflg + lVar28) =
         *(undefined8 *)((long)local_120 + lVar28 + 0x20);
    uVar27 = *(undefined8 *)((long)local_120 + lVar28);
    uVar10 = ((undefined8 *)((long)local_120 + lVar28))[1];
    puVar4 = (undefined8 *)((long)local_120 + lVar28 + 0x10);
    uVar11 = puVar4[1];
    puVar3 = (undefined8 *)((long)&nounlist[lVar30].vocollst + lVar28);
    *puVar3 = *puVar4;
    puVar3[1] = uVar11;
    puVar4 = (undefined8 *)((long)&nounlist[lVar30].vocolobj + lVar28);
    *puVar4 = uVar27;
    puVar4[1] = uVar10;
    if (199 < lVar35) {
      pcVar29 = "You\'re referring to too many objects.";
      iVar18 = 0xb;
      goto LAB_001f793d;
    }
    lVar35 = lVar35 + 1;
  }
  local_a0 = lVar35;
  if ((char)local_58 != '\0') goto LAB_001f7a7d;
  uVar23 = *local_110;
  local_78 = (ulong)uVar23;
  if (local_78 == 0xffffffff) goto LAB_001f7a7d;
  pcVar29 = cmd[(int)uVar23];
  if ((pcVar29 == (char *)0x0) || (*pcVar29 != ',')) goto LAB_001f7a7d;
  lVar30 = 0;
  while ((pcVar29 != (char *)0x0 && (*pcVar29 == ','))) {
    lVar35 = (int)uVar23 + lVar30;
    lVar30 = lVar30 + 1;
    pcVar29 = local_60[lVar35];
  }
  cur = (int)lVar30 + uVar23;
  local_114 = (uint)(local_114 != 0) * 2;
  local_b4 = 0;
  goto LAB_001f679e;
LAB_001f76e3:
  if ((uint *)(ulong)uVar23 == puVar37) goto LAB_001f77b8;
  if ((ctx->voccxflg & 4) != 0) {
    outformat("..... ");
    runpprop(ctx->voccxrun,(uchar **)0x0,0,0,local_e8[(long)puVar37],8,0,0,local_e8[(long)puVar37]);
    outflushn(1);
    puVar36 = local_c0;
  }
  *(char **)(puVar33 + -6) = cmd[local_148];
  *(char **)(puVar33 + -4) = cmd[lVar35 + -1];
  uVar16 = local_98[(long)puVar37] | (uint)bVar39 << 5 | local_fc;
  *puVar33 = uVar16;
  if (!bVar38) {
    *(char **)(puVar33 + -2) = cmd[lVar30 + -1];
  }
  if ((char)local_124 != '\0') {
    *puVar33 = uVar16 | 0x80;
  }
  *(objnum *)(puVar33 + -8) = local_e8[(long)puVar37];
  if (puVar36 == puVar37) {
    vocerr(ctx,10,"You\'re referring to too many objects with \"%s\".",local_b0);
    uVar16 = 0xfffffffe;
    goto LAB_001f7a98;
  }
  puVar37 = (uint *)((long)puVar37 + 1);
  puVar33 = puVar33 + 10;
  goto LAB_001f76e3;
LAB_001f77b8:
  prVar32 = (runcxdef *)(local_f8 + (long)puVar37);
  if (((local_e0 == (uint)local_c8) && (cVar6 = *cmd[local_148], -1 < (long)cVar6)) &&
     (ppuVar22 = __ctype_b_loc(), (*(byte *)((long)*ppuVar22 + (long)cVar6 * 2 + 1) & 8) != 0)) {
    *(objnum *)(puVar33 + -8) = ctx->voccxnum;
    *puVar33 = 0x10;
    pcVar29 = cmd[local_148];
    *(char **)(puVar33 + -4) = pcVar29;
    *(char **)(puVar33 + -6) = pcVar29;
    prVar32 = (runcxdef *)(ulong)((int)local_f8 + (int)puVar37 + 1);
  }
  local_120[(long)(int)prVar32 * 0x14] = 0xffff;
  *(undefined4 *)(local_120 + (long)(int)prVar32 * 0x14 + 0x10) = 0;
  goto LAB_001f6f86;
}

Assistant:

int vocgobj(voccxdef *ctx, char *cmd[], int typelist[],
            int cur, int *next, int complain, vocoldef *nounlist,
            int multi, int chkact, int *no_match)
{
    int       cnt;
    int       outcnt = 0;
    int       i;
    int       again = FALSE;
    int       lastcur;
    vocoldef *tmplist;
    uchar    *save_sp;

    voc_enter(ctx, &save_sp);
    VOC_MAX_ARRAY(ctx, vocoldef, tmplist);

    for ( ;; )
    {
        /* try getting a single object */
        cnt = vocg1o(ctx, cmd, typelist, cur, next, complain,
                     tmplist, chkact, no_match);

        /* if we encountered a syntax error, return failure */
        if (cnt < 0)
        {
            VOC_RETVAL(ctx, save_sp, cnt);
        }

        /* if we got any objects, store them in our output list */
        if (cnt > 0)
        {
            for (i = 0 ; i < cnt ; ++i)
            {
                OSCPYSTRUCT(nounlist[outcnt], tmplist[i]);
                if (++outcnt > VOCMAXAMBIG)
                {
                    vocerr(ctx, VOCERR(11),
                           "You're referring to too many objects.");
                    VOC_RETVAL(ctx, save_sp, -1);
                }
            }
        }

        /* if we didn't find any objects, stop looking */
        if (cnt == 0)
        {
            if (again)
                *next = lastcur;
            break;
        }

        /* 
         *   if the caller only wanted a single object (or is getting an
         *   actor, in which case they implicitly want only a single
         *   object), stop looking for additional noun phrases 
         */
        if (!multi || chkact)
            break;

        /* skip past the previous noun phrase */
        cur = *next;

        /* 
         *   if we're looking at a noun phrase separator ("and" or a
         *   comma), get the next noun phrase; otherwise, we're done 
         */
        if (cur != -1 && cmd[cur] != 0 && vocspec(cmd[cur], VOCW_AND))
        {
            lastcur = cur;
            while (cmd[cur] && vocspec(cmd[cur], VOCW_AND)) ++cur;
            again = TRUE;
            if (complain) complain = 2;
        }
        else
        {
            /* end of line, or not at a separator - we're done */
            break;
        }
    }

    /* terminate the list and return the number of objects we found */
    nounlist[outcnt].vocolobj = MCMONINV;
    nounlist[outcnt].vocolflg = 0;
    VOC_RETVAL(ctx, save_sp, outcnt);
}